

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *v;
  bool bVar1;
  bool bVar2;
  int iVar3;
  LogLevel LVar4;
  long lVar5;
  UnitTest *this;
  undefined8 extraout_RAX;
  bool listTests;
  char *googleArgv [4];
  string filter;
  int googleArgc;
  string testFilter;
  string logLevel;
  PBRTOptions opt;
  bool local_271;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  PBRTOptions local_128;
  
  local_128.imageFile._M_dataplus._M_p = (pointer)&local_128.imageFile.field_2;
  local_128.mseReferenceImage._M_dataplus._M_p = (pointer)&local_128.mseReferenceImage.field_2;
  local_128.mseReferenceOutput._M_dataplus._M_p = (pointer)&local_128.mseReferenceOutput.field_2;
  local_128.super_BasicOptions.nThreads = 0;
  local_128.super_BasicOptions.seed = 0;
  local_128.super_BasicOptions.renderingSpace = CameraWorld;
  local_128.logLevel = Error;
  local_128.pixelSamples.set = false;
  local_128.gpuDevice.set = false;
  local_128.imageFile._M_string_length = 0;
  local_128.imageFile.field_2._M_local_buf[0] = '\0';
  local_128.mseReferenceImage._M_string_length = 0;
  local_128.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_128.debugStart._M_dataplus._M_p = (pointer)&local_128.debugStart.field_2;
  local_128.mseReferenceOutput._M_string_length = 0;
  local_128.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_128.debugStart._M_string_length = 0;
  local_128.debugStart.field_2._M_local_buf[0] = '\0';
  local_128.displayServer._M_dataplus._M_p = (pointer)&local_128.displayServer.field_2;
  local_128.displayServer._M_string_length = 0;
  local_128.displayServer.field_2._M_local_buf[0] = '\0';
  local_128.cropWindow.set = false;
  local_128.pixelBounds.set = false;
  local_128.super_BasicOptions.quickRender = false;
  local_128.super_BasicOptions.quiet = true;
  local_128.super_BasicOptions.recordPixelStatistics = false;
  local_128.super_BasicOptions.upgrade = false;
  local_128.super_BasicOptions.disablePixelJitter = false;
  local_128.super_BasicOptions.disableWavelengthJitter = false;
  local_128.super_BasicOptions.forceDiffuse = false;
  local_128.super_BasicOptions.useGPU = false;
  local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"error","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(argv + 1);
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_271 = false;
  do {
    if (local_270->_M_allocated_capacity == 0) {
      LVar4 = pbrt::LogLevelFromString(&local_1c8);
      local_128.logLevel = LVar4;
      pbrt::InitPBRT(&local_128);
      local_208._M_dataplus._M_p._0_4_ = 1;
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      local_268._M_string_length = 0;
      local_268.field_2._M_allocated_capacity = 0;
      local_268.field_2._8_8_ = 0;
      local_268._M_dataplus._M_p = (pointer)local_270->_M_allocated_capacity;
      local_248._M_string_length = 0;
      local_248.field_2._M_local_buf[0] = '\0';
      if (local_1e8._M_string_length != 0) {
        local_228._M_string_length = 0;
        local_228.field_2._M_local_buf[0] = '\0';
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        pbrt::detail::stringPrintfRecursive<std::__cxx11::string&>
                  (&local_228,"--gtest_filter=%s",&local_1e8);
        std::__cxx11::string::operator=((string *)&local_248,(string *)&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
        (&local_268._M_dataplus)[(int)local_208._M_dataplus._M_p]._M_p = local_248._M_dataplus._M_p;
        local_208._M_dataplus._M_p._0_4_ = (int)local_208._M_dataplus._M_p + 1;
      }
      if (local_271 == true) {
        lVar5 = (long)(int)local_208._M_dataplus._M_p;
        local_208._M_dataplus._M_p._0_4_ = (int)local_208._M_dataplus._M_p + 1;
        (&local_268._M_dataplus)[lVar5]._M_p = "--gtest_list_tests";
      }
      testing::InitGoogleTest((int *)&local_208,(char **)&local_268);
      this = testing::UnitTest::GetInstance();
      iVar3 = testing::UnitTest::Run(this);
      pbrt::CleanupPBRT();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_128.pixelBounds.set == true) {
        local_128.pixelBounds.set = false;
      }
      if (local_128.cropWindow.set == true) {
        local_128.cropWindow.set = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.displayServer._M_dataplus._M_p != &local_128.displayServer.field_2) {
        operator_delete(local_128.displayServer._M_dataplus._M_p,
                        CONCAT71(local_128.displayServer.field_2._M_allocated_capacity._1_7_,
                                 local_128.displayServer.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.debugStart._M_dataplus._M_p != &local_128.debugStart.field_2) {
        operator_delete(local_128.debugStart._M_dataplus._M_p,
                        CONCAT71(local_128.debugStart.field_2._M_allocated_capacity._1_7_,
                                 local_128.debugStart.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.mseReferenceOutput._M_dataplus._M_p != &local_128.mseReferenceOutput.field_2)
      {
        operator_delete(local_128.mseReferenceOutput._M_dataplus._M_p,
                        CONCAT71(local_128.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                                 local_128.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.mseReferenceImage._M_dataplus._M_p != &local_128.mseReferenceImage.field_2) {
        operator_delete(local_128.mseReferenceImage._M_dataplus._M_p,
                        CONCAT71(local_128.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                                 local_128.mseReferenceImage.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.imageFile._M_dataplus._M_p != &local_128.imageFile.field_2) {
        operator_delete(local_128.imageFile._M_dataplus._M_p,
                        CONCAT71(local_128.imageFile.field_2._M_allocated_capacity._1_7_,
                                 local_128.imageFile.field_2._M_local_buf[0]) + 1);
      }
      return iVar3;
    }
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"list-tests","");
    local_148._M_unused._M_object = (void *)0x0;
    local_148._8_8_ = 0;
    local_130 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                ::_M_manager;
    bVar1 = pbrt::ParseArg<bool*>
                      ((char ***)&local_270,&local_268,&local_271,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_148);
    bVar2 = true;
    if (!bVar1) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"log-level","");
      local_168._M_unused._M_object = (void *)0x0;
      local_168._8_8_ = 0;
      local_150 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_invoke;
      local_158 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                  ::_M_manager;
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        ((char ***)&local_270,&local_248,&local_1c8,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_168);
      bVar2 = true;
      if (!bVar1) {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"nthreads","");
        local_188._M_unused._M_object = (void *)0x0;
        local_188._8_8_ = 0;
        local_170 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                    ::_M_invoke;
        local_178 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                    ::_M_manager;
        bVar1 = pbrt::ParseArg<int*>
                          ((char ***)&local_270,&local_228,(int *)&local_128,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_188);
        bVar2 = true;
        if (!bVar1) {
          local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"test-filter","");
          local_1a8._M_unused._M_object = (void *)0x0;
          local_1a8._8_8_ = 0;
          local_190 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                      ::_M_invoke;
          local_198 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt_test.cpp:44:24)>
                      ::_M_manager;
          bVar2 = pbrt::ParseArg<std::__cxx11::string*>
                            ((char ***)&local_270,&local_208,&local_1e8,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1a8);
          if (local_198 != (code *)0x0) {
            (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,
                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                   local_228.field_2._M_local_buf[0]) + 1);
        }
      }
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,
                        CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                 local_248.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_138 != (code *)0x0) {
      (*local_138)(&local_148,&local_148,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    v = local_270;
  } while (bVar2 != false);
  __s1 = *(char **)local_270;
  iVar3 = strcmp(__s1,"--help");
  if ((iVar3 == 0) || (((*__s1 == '-' && (__s1[1] == 'h')) && (__s1[2] == '\0')))) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"");
  }
  else {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    local_268._M_string_length = 0;
    local_268.field_2._M_allocated_capacity =
         local_268.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pbrt::detail::stringPrintfRecursive<char*&>
              (&local_268,"argument \"%s\" unknown",(char **)&v->_M_allocated_capacity);
  }
  usage(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != v) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                             local_228.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  pbrt::PBRTOptions::~PBRTOptions(&local_128);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char **argv) {
    PBRTOptions opt;
    opt.quiet = true;
    std::string logLevel = "error";
    std::string testFilter;
    bool listTests = false;

    char **origArgv = argv;
    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        if (ParseArg(&argv, "list-tests", &listTests, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "nthreads", &opt.nThreads, onError) ||
            ParseArg(&argv, "test-filter", &testFilter, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    opt.logLevel = LogLevelFromString(logLevel);

    InitPBRT(opt);

    int googleArgc = 1;
    const char *googleArgv[4] = {};
    googleArgv[0] = argv[0];
    std::string filter;
    if (!testFilter.empty()) {
        filter = StringPrintf("--gtest_filter=%s", testFilter);
        googleArgv[googleArgc++] = filter.c_str();
    }
    if (listTests)
        googleArgv[googleArgc++] = "--gtest_list_tests";

    testing::InitGoogleTest(&googleArgc, (char **)googleArgv);

    int ret = RUN_ALL_TESTS();

    CleanupPBRT();

    return ret;
}